

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSolve2LinearConstraint.cpp
# Opt level: O0

void __thiscall
btSolve2LinearConstraint::resolveBilateralPairConstraint
          (btSolve2LinearConstraint *this,btRigidBody *body1,btRigidBody *body2,btMatrix3x3 *world2A
          ,btMatrix3x3 *world2B,btVector3 *invInertiaADiag,btScalar invMassA,btVector3 *linvelA,
          btVector3 *angvelA,btVector3 *rel_posA1,btVector3 *invInertiaBDiag,btScalar invMassB,
          btVector3 *linvelB,btVector3 *angvelB,btVector3 *rel_posA2,btScalar depthA,
          btVector3 *normalA,btVector3 *rel_posB1,btVector3 *rel_posB2,btScalar depthB,
          btVector3 *normalB,btScalar *imp0,btScalar *imp1)

{
  float *in_RDI;
  btScalar bVar1;
  float fVar2;
  float fVar3;
  btScalar bVar4;
  btScalar bVar5;
  float fVar6;
  float in_XMM2_Da;
  float in_XMM3_Da;
  btVector3 bVar7;
  btVector3 *in_stack_00000040;
  btScalar invDet;
  btScalar nonDiag;
  btScalar dv1;
  btScalar dv0;
  float *in_stack_00000068;
  btScalar vel1;
  btScalar vel0;
  btJacobianEntry jacB;
  btJacobianEntry jacA;
  btScalar len;
  btVector3 *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  btVector3 local_134;
  btScalar local_124;
  btJacobianEntry *this_00;
  undefined1 in_stack_fffffffffffffef0 [16];
  btVector3 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff10;
  btScalar in_stack_ffffffffffffff14;
  btMatrix3x3 *in_stack_ffffffffffffff18;
  btJacobianEntry *in_stack_ffffffffffffff20;
  btVector3 *in_stack_ffffffffffffff30;
  btVector3 *in_stack_ffffffffffffff38;
  btJacobianEntry local_98;
  float local_44;
  float local_40;
  float local_3c;
  
  *_dv0 = 0.0;
  *in_stack_00000068 = 0.0;
  local_40 = in_XMM3_Da;
  local_3c = in_XMM2_Da;
  bVar1 = btVector3::length((btVector3 *)0x22507b);
  bVar1 = btFabs(bVar1);
  local_44 = bVar1 - 1.0;
  bVar1 = btFabs(local_44);
  if (bVar1 < 1.1920929e-07) {
    btJacobianEntry::btJacobianEntry
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
               (btMatrix3x3 *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               in_stack_ffffffffffffff00.m_floats._8_8_,in_stack_ffffffffffffff00.m_floats._0_8_,
               in_stack_fffffffffffffef0._8_8_,in_stack_ffffffffffffff30,
               in_stack_fffffffffffffef0._4_4_,in_stack_ffffffffffffff38,
               in_stack_fffffffffffffef0._0_4_);
    btJacobianEntry::btJacobianEntry
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
               (btMatrix3x3 *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               in_stack_ffffffffffffff00.m_floats._8_8_,in_stack_ffffffffffffff00.m_floats._0_8_,
               in_stack_fffffffffffffef0._8_8_,in_stack_ffffffffffffff30,
               in_stack_fffffffffffffef0._4_4_,in_stack_ffffffffffffff38,
               in_stack_fffffffffffffef0._0_4_);
    bVar7 = btRigidBody::getVelocityInLocalPoint
                      ((btRigidBody *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                       in_stack_fffffffffffffe58);
    this_00 = bVar7.m_floats._0_8_;
    bVar7 = btRigidBody::getVelocityInLocalPoint
                      ((btRigidBody *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                       in_stack_fffffffffffffe58);
    operator-((btVector3 *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
              in_stack_fffffffffffffe58);
    bVar1 = btVector3::dot(in_stack_00000040,(btVector3 *)&stack0xffffffffffffff00);
    btRigidBody::getVelocityInLocalPoint
              ((btRigidBody *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
               in_stack_fffffffffffffe58);
    btRigidBody::getVelocityInLocalPoint
              ((btRigidBody *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
               in_stack_fffffffffffffe58);
    local_134 = operator-((btVector3 *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60)
                          ,in_stack_fffffffffffffe58);
    local_124 = btVector3::dot(_nonDiag,&local_134);
    fVar2 = local_3c * *in_RDI + -(bVar1 * in_RDI[1]);
    fVar3 = local_40 * *in_RDI + -(local_124 * in_RDI[1]);
    bVar1 = btJacobianEntry::getNonDiagonal
                      (this_00,bVar7.m_floats._8_8_,bVar7.m_floats[1],bVar7.m_floats[0]);
    bVar4 = btJacobianEntry::getDiagonal(&local_98);
    bVar5 = btJacobianEntry::getDiagonal((btJacobianEntry *)&stack0xffffffffffffff14);
    fVar6 = 1.0 / (bVar4 * bVar5 + -(bVar1 * bVar1));
    bVar4 = btJacobianEntry::getDiagonal(&local_98);
    *_dv0 = fVar2 * bVar4 * fVar6 + fVar3 * -bVar1 * fVar6;
    bVar4 = btJacobianEntry::getDiagonal((btJacobianEntry *)&stack0xffffffffffffff14);
    *in_stack_00000068 = fVar3 * bVar4 * fVar6 + fVar2 * -bVar1 * fVar6;
    if (*_dv0 <= 0.0) {
      *_dv0 = 0.0;
      bVar1 = btJacobianEntry::getDiagonal((btJacobianEntry *)&stack0xffffffffffffff14);
      *in_stack_00000068 = fVar3 / bVar1;
      if (*in_stack_00000068 <= 0.0) {
        *in_stack_00000068 = 0.0;
        bVar1 = btJacobianEntry::getDiagonal(&local_98);
        *_dv0 = fVar2 / bVar1;
        if (*_dv0 <= 0.0) {
          *_dv0 = 0.0;
        }
      }
    }
    else if (*in_stack_00000068 <= 0.0) {
      *in_stack_00000068 = 0.0;
      bVar1 = btJacobianEntry::getDiagonal(&local_98);
      *_dv0 = fVar2 / bVar1;
      if (*_dv0 <= 0.0) {
        *_dv0 = 0.0;
      }
    }
  }
  return;
}

Assistant:

void btSolve2LinearConstraint::resolveBilateralPairConstraint(
						btRigidBody* body1,
						btRigidBody* body2,
						const btMatrix3x3& world2A,
						const btMatrix3x3& world2B,
						
						const btVector3& invInertiaADiag,
						const btScalar invMassA,
						const btVector3& linvelA,const btVector3& angvelA,
						const btVector3& rel_posA1,
						const btVector3& invInertiaBDiag,
						const btScalar invMassB,
						const btVector3& linvelB,const btVector3& angvelB,
						const btVector3& rel_posA2,

					  btScalar depthA, const btVector3& normalA, 
					  const btVector3& rel_posB1,const btVector3& rel_posB2,
					  btScalar depthB, const btVector3& normalB, 
					  btScalar& imp0,btScalar& imp1)
{

	(void)linvelA;
	(void)linvelB;
	(void)angvelA;
	(void)angvelB;



	imp0 = btScalar(0.);
	imp1 = btScalar(0.);

	btScalar len = btFabs(normalA.length()) - btScalar(1.);
	if (btFabs(len) >= SIMD_EPSILON)
		return;

	btAssert(len < SIMD_EPSILON);


	//this jacobian entry could be re-used for all iterations
	btJacobianEntry jacA(world2A,world2B,rel_posA1,rel_posA2,normalA,invInertiaADiag,invMassA,
		invInertiaBDiag,invMassB);
	btJacobianEntry jacB(world2A,world2B,rel_posB1,rel_posB2,normalB,invInertiaADiag,invMassA,
		invInertiaBDiag,invMassB);
	
	//const btScalar vel0 = jacA.getRelativeVelocity(linvelA,angvelA,linvelB,angvelB);
	//const btScalar vel1 = jacB.getRelativeVelocity(linvelA,angvelA,linvelB,angvelB);

	const btScalar vel0 = normalA.dot(body1->getVelocityInLocalPoint(rel_posA1)-body2->getVelocityInLocalPoint(rel_posA1));
	const btScalar vel1 = normalB.dot(body1->getVelocityInLocalPoint(rel_posB1)-body2->getVelocityInLocalPoint(rel_posB1));

	// calculate rhs (or error) terms
	const btScalar dv0 = depthA  * m_tau - vel0 * m_damping;
	const btScalar dv1 = depthB  * m_tau - vel1 * m_damping;

	// dC/dv * dv = -C
	
	// jacobian * impulse = -error
	//

	//impulse = jacobianInverse * -error

	// inverting 2x2 symmetric system (offdiagonal are equal!)
	// 


	btScalar nonDiag = jacA.getNonDiagonal(jacB,invMassA,invMassB);
	btScalar	invDet = btScalar(1.0) / (jacA.getDiagonal() * jacB.getDiagonal() - nonDiag * nonDiag );
	
	//imp0 = dv0 * jacA.getDiagonal() * invDet + dv1 * -nonDiag * invDet;
	//imp1 = dv1 * jacB.getDiagonal() * invDet + dv0 * - nonDiag * invDet;

	imp0 = dv0 * jacA.getDiagonal() * invDet + dv1 * -nonDiag * invDet;
	imp1 = dv1 * jacB.getDiagonal() * invDet + dv0 * - nonDiag * invDet;

	//[a b]								  [d -c]
	//[c d] inverse = (1 / determinant) * [-b a] where determinant is (ad - bc)

	//[jA nD] * [imp0] = [dv0]
	//[nD jB]   [imp1]   [dv1]

	if ( imp0 > btScalar(0.0))
	{
		if ( imp1 > btScalar(0.0) )
		{
			//both positive
		}
		else
		{
			imp1 = btScalar(0.);

			// now imp0>0 imp1<0
			imp0 = dv0 / jacA.getDiagonal();
			if ( imp0 > btScalar(0.0) )
			{
			} else
			{
				imp0 = btScalar(0.);
			}
		}
	}
	else
	{
		imp0 = btScalar(0.);

		imp1 = dv1 / jacB.getDiagonal();
		if ( imp1 <= btScalar(0.0) )
		{
			imp1 = btScalar(0.);
			// now imp0>0 imp1<0
			imp0 = dv0 / jacA.getDiagonal();
			if ( imp0 > btScalar(0.0) )
			{
			} else
			{
				imp0 = btScalar(0.);
			}
		} else
		{
		}
	}
}